

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

int __thiscall cmCTestMultiProcessHandler::FindMaxIndex(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_color _Var2;
  
  _Var2 = _S_red;
  for (p_Var1 = (this->PendingTests).
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->PendingTests).
       super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if ((int)_Var2 < (int)p_Var1[1]._M_color) {
      _Var2 = p_Var1[1]._M_color;
    }
  }
  return _Var2;
}

Assistant:

int cmCTestMultiProcessHandler::FindMaxIndex()
{
  int max = 0;
  for (auto const& i : this->PendingTests) {
    if (i.first > max) {
      max = i.first;
    }
  }
  return max;
}